

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFJob.cc
# Opt level: O2

void __thiscall
QPDFJob::handlePageSpecs
          (QPDFJob *this,QPDF *pdf,
          vector<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>,_std::allocator<std::unique_ptr<QPDF,_std::default_delete<QPDF>_>_>_>
          *page_heap)

{
  pointer pPVar1;
  pointer puVar2;
  pointer puVar3;
  value_type vVar4;
  int *piVar5;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> uVar6;
  pointer pQVar7;
  bool bVar8;
  __type_conflict1 _Var9;
  bool bVar10;
  int iVar11;
  element_type *peVar12;
  mapped_type *ppQVar13;
  size_type sVar14;
  FileInputSource *this_00;
  ClosedFileInputSource *pCVar15;
  __uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true> *p_Var16;
  mapped_type *ppCVar17;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__args;
  _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  *p_Var18;
  pointer __result;
  pointer pQVar19;
  reference pvVar20;
  size_type sVar21;
  _Base_ptr p_Var22;
  QPDFPageData *pQVar23;
  pointer pQVar24;
  pointer pQVar25;
  pointer pQVar26;
  QPDFAcroFormDocumentHelper *this_01;
  size_type sVar27;
  QPDFAcroFormDocumentHelper *this_02;
  unsigned_long __n_00;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *p_Var28;
  mapped_type *this_03;
  size_type sVar29;
  _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
  *this_04;
  mapped_type_conflict1 *pmVar30;
  size_type sVar31;
  reference pvVar32;
  QPDFObjGen og;
  reference this_05;
  undefined8 extraout_RAX;
  _Tp_alloc_type *p_Var33;
  int *piVar34;
  char *__s;
  char *__s_00;
  PageSpec *page_spec;
  char *pcVar35;
  pointer pPVar36;
  QPDF *pQVar37;
  pointer pQVar38;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_06;
  ulong uVar39;
  QPDFPageData *pQVar40;
  QPDFPageData *__n_01;
  size_t __n_02;
  ulong __n_03;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_R8;
  _Distance __n;
  ulong uVar41;
  size_type i;
  long lVar42;
  ClosedFileInputSource *pCVar43;
  QPDFPageData *pQVar44;
  QPDFFormFieldObjectHelper *pQVar45;
  QPDFPageData *local_530;
  QPDFPageData *local_528;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  unique_ptr<QPDF,_std::default_delete<QPDF>_> qpdf_sp;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_4a8 [3];
  QPDFPageData *local_478;
  QPDFPageData *local_470;
  ClosedFileInputSource *local_468;
  int pageno;
  QPDFPageLabelDocumentHelper pldh;
  vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  parsed_specs;
  unsigned_long_long from_uuid;
  QPDFObjectHandle new_fields;
  QPDFObjectHandle fields;
  QPDFObjectHandle new_page;
  QPDFObjGen to_copy_og;
  vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_> orig_pages;
  QPDFArrayItems local_3a8 [2];
  vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_> new_labels;
  QPDFObjectHandle local_368;
  _Any_data local_358;
  code *local_348;
  code *local_340;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_338;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_328;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_318;
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_308;
  QPDFPageDocumentHelper dh;
  __shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> local_2d8;
  _Any_data local_2c8;
  code *local_2b8;
  code *local_2b0;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
  page_spec_qpdfs;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
  page_spec_cfis;
  set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_> referenced_fields;
  map<unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
  afdh_map;
  set<int,_std::less<int>,_std::allocator<int>_> selected_from_orig;
  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
  remove_unreferenced;
  map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
  copied_pages;
  _Any_data local_158;
  code *local_148;
  code *local_140;
  _Any_data local_130;
  code *local_120;
  code *local_118;
  QPDFPageObjectHelper local_110;
  QPDFPageObjectHelper local_d8;
  QPDFPageObjectHelper local_a0;
  QPDFPageObjectHelper local_68;
  
  peVar12 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pPVar36 = *(pointer *)
             ((long)&(peVar12->page_specs).
                     super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                     _M_impl.super__Vector_impl_data + 8);
  for (pcVar35 = (char *)((long)(peVar12->page_specs).
                                super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>
                                ._M_impl.super__Vector_impl_data._M_start + 0x30);
      pPVar1 = (pointer)(pcVar35 + -0x30), pPVar1 != pPVar36; pcVar35 = pcVar35 + 0x50) {
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            pPVar1,".");
    if (bVar8) {
      std::__cxx11::string::assign((char *)pPVar1);
    }
    if (*(long *)(pcVar35 + 8) == 0) {
      std::__cxx11::string::assign(pcVar35);
    }
  }
  peVar12 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar12->keep_files_open_set == false) {
    filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &filenames._M_t._M_impl.super__Rb_tree_header._M_header;
    filenames._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ =
         filenames._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
    filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    filenames._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pPVar1 = *(pointer *)
              ((long)&(peVar12->page_specs).
                      super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                      _M_impl.super__Vector_impl_data + 8);
    filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    for (pPVar36 = (peVar12->page_specs).
                   super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl
                   .super__Vector_impl_data._M_start; pPVar36 != pPVar1; pPVar36 = pPVar36 + 1) {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)&filenames,&pPVar36->filename);
    }
    peVar12 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    peVar12->keep_files_open =
         filenames._M_t._M_impl.super__Rb_tree_header._M_node_count <=
         peVar12->keep_files_open_threshold;
    local_130._8_8_ = 0;
    local_118 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2431:21)>
                ::_M_invoke;
    local_120 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2431:21)>
                ::_M_manager;
    local_130._M_unused._M_object = this;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_130);
    std::_Function_base::~_Function_base((_Function_base *)&local_130);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~_Rb_tree(&filenames._M_t);
    peVar12 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  }
  page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_header;
  page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_header;
  page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       page_spec_cfis._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&filenames,
             (peVar12->infilename).super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             (allocator<char> *)&qpdf_sp);
  ppQVar13 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
             ::operator[](&page_spec_qpdfs,(key_type *)&filenames);
  *ppQVar13 = pdf;
  std::__cxx11::string::~string((string *)&filenames);
  parsed_specs.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  copied_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &copied_pages._M_t._M_impl.super__Rb_tree_header._M_header;
  copied_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  copied_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  copied_pages._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  parsed_specs.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  parsed_specs.
  super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  peVar12 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  pQVar44 = *(QPDFPageData **)
             ((long)&(peVar12->page_specs).
                     super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>.
                     _M_impl.super__Vector_impl_data + 8);
  pQVar40 = (QPDFPageData *)
            (peVar12->page_specs).
            super__Vector_base<QPDFJob::PageSpec,_std::allocator<QPDFJob::PageSpec>_>._M_impl.
            super__Vector_impl_data._M_start;
  pQVar25 = (pointer)0x0;
  copied_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       copied_pages._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (pQVar23 = pQVar40;
      pQVar24 = parsed_specs.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_finish, pQVar23 != pQVar44;
      pQVar23 = (QPDFPageData *)
                &(pQVar23->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage) {
    sVar14 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
             ::count(&page_spec_qpdfs,&pQVar23->filename);
    if (sVar14 == 0) {
      pQVar37 = pQVar23->qpdf;
      if ((pQVar37 == (QPDF *)0x0) &&
         (peVar12 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                    _M_ptr, (peVar12->encryption_file)._M_string_length != 0)) {
        _Var9 = std::operator==(&pQVar23->filename,&peVar12->encryption_file);
        if (_Var9) {
          pQVar37 = (QPDF *)(((this->m).
                              super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                             _M_ptr)->encryption_file_password).
                            super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        }
        else {
          pQVar37 = (QPDF *)0x0;
        }
      }
      local_2c8._8_8_ = 0;
      local_2b0 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2458:25)>
                  ::_M_invoke;
      local_2b8 = std::
                  _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2458:25)>
                  ::_M_manager;
      local_2c8._M_unused._0_8_ = (undefined8)pQVar40;
      doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)&local_2c8);
      std::_Function_base::~_Function_base((_Function_base *)&local_2c8);
      filenames._M_t._M_impl._0_8_ = 0;
      filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
      filenames._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
      if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
          keep_files_open == false) {
        pCVar15 = (ClosedFileInputSource *)operator_new(0xe8);
        ClosedFileInputSource::ClosedFileInputSource(pCVar15,(pQVar23->filename)._M_dataplus._M_p);
        std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<ClosedFileInputSource,void>
                  ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&qpdf_sp,pCVar15);
        std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&filenames,
                   (__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&qpdf_sp);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
        ClosedFileInputSource::stayOpen(pCVar15,true);
      }
      else {
        this_00 = (FileInputSource *)operator_new(0xd8);
        FileInputSource::FileInputSource(this_00,(pQVar23->filename)._M_dataplus._M_p);
        std::__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2>::
        __shared_ptr<FileInputSource,void>
                  ((__shared_ptr<InputSource,(__gnu_cxx::_Lock_policy)2> *)&qpdf_sp,this_00);
        std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::operator=
                  ((__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&filenames,
                   (__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&qpdf_sp);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
        pCVar15 = (ClosedFileInputSource *)0x0;
      }
      qpdf_sp._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
      super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
      super__Head_base<0UL,_QPDF_*,_false>._M_head_impl =
           (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true>)
           (__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>)0x0;
      std::__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_2d8,(__shared_ptr<InputSource,_(__gnu_cxx::_Lock_policy)2> *)&filenames);
      in_R8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x1;
      processInputSource(this,&qpdf_sp,(shared_ptr<InputSource> *)&local_2d8,(char *)pQVar37,true);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_2d8._M_refcount);
      uVar6 = qpdf_sp;
      p_Var16 = (__uniq_ptr_data<QPDF,_std::default_delete<QPDF>,_true,_true> *)
                std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
                ::operator[](&page_spec_qpdfs,&pQVar23->filename);
      p_Var16->super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_> =
           (__uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>)
           uVar6._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
           super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
           super__Head_base<0UL,_QPDF_*,_false>._M_head_impl;
      std::
      vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>
      ::emplace_back<std::unique_ptr<QPDF,std::default_delete<QPDF>>>
                ((vector<std::unique_ptr<QPDF,std::default_delete<QPDF>>,std::allocator<std::unique_ptr<QPDF,std::default_delete<QPDF>>>>
                  *)page_heap,&qpdf_sp);
      if (pCVar15 != (ClosedFileInputSource *)0x0) {
        ClosedFileInputSource::stayOpen(pCVar15,false);
        ppCVar17 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[](&page_spec_cfis,&pQVar23->filename);
        *ppCVar17 = pCVar15;
      }
      std::unique_ptr<QPDF,_std::default_delete<QPDF>_>::~unique_ptr(&qpdf_sp);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                 &filenames._M_t._M_impl.super__Rb_tree_header);
    }
    __args = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
             ::operator[](&page_spec_qpdfs,&pQVar23->filename);
    p_Var33 = (_Tp_alloc_type *)
              &(pQVar23->orig_pages).
               super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
               super__Vector_impl_data._M_finish;
    if (pQVar24 ==
        parsed_specs.
        super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      __n_01 = pQVar23;
      p_Var18 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 *)std::
                   vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                   ::_M_check_len(&parsed_specs,(size_type)pQVar23,__s);
      __result = std::
                 _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ::_M_allocate(p_Var18,(size_t)__n_01);
      lVar42 = (long)pQVar24 - (long)pQVar25;
      std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
      construct<(anonymous_namespace)::QPDFPageData,std::__cxx11::string&,QPDF*&,std::__cxx11::string&>
                ((allocator_type *)((long)__result + lVar42),pQVar23,__args,(QPDF **)p_Var33,in_R8);
      pQVar19 = std::
                vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ::_S_relocate(pQVar25,pQVar24,__result,p_Var33);
      pQVar19 = std::
                vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ::_S_relocate(pQVar24,pQVar24,pQVar19 + 1,p_Var33);
      std::
      _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ::_M_deallocate((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       *)pQVar25,(pointer)(lVar42 / 0x58),lVar42 % 0x58);
      parsed_specs.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = __result + (long)p_Var18;
      parsed_specs.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_start = __result;
    }
    else {
      std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
      construct<(anonymous_namespace)::QPDFPageData,std::__cxx11::string&,QPDF*&,std::__cxx11::string&>
                ((allocator_type *)pQVar24,pQVar23,__args,(QPDF **)p_Var33,in_R8);
      pQVar19 = pQVar24 + 1;
      __result = pQVar25;
    }
    pQVar40 = (QPDFPageData *)
              &(pQVar40->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pQVar25 = __result;
    parsed_specs.
    super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pQVar19;
  }
  remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_header;
  remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       remove_unreferenced._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
      remove_unreferenced_page_resources != re_no) {
    for (p_Var22 = page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var22 != &page_spec_qpdfs._M_t._M_impl.super__Rb_tree_header;
        p_Var22 = (_Base_ptr)std::_Rb_tree_increment(p_Var22)) {
      sVar27 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
               ::count(&page_spec_cfis,(key_type *)(p_Var22 + 1));
      if (sVar27 == 0) {
        pCVar15 = (ClosedFileInputSource *)0x0;
      }
      else {
        ppCVar17 = std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                   ::operator[](&page_spec_cfis,(key_type *)(p_Var22 + 1));
        pCVar15 = *ppCVar17;
        ClosedFileInputSource::stayOpen(pCVar15,true);
      }
      pQVar37 = *(QPDF **)(p_Var22 + 2);
      filenames._M_t._M_impl._0_8_ = QPDF::getUniqueId(pQVar37);
      sVar21 = std::
               map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
               ::count(&remove_unreferenced,(key_type_conflict *)&filenames);
      if (sVar21 == 0) {
        bVar8 = shouldRemoveUnreferencedResources(this,pQVar37);
        pmVar30 = std::
                  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                  ::operator[](&remove_unreferenced,(key_type_conflict *)&filenames);
        *pmVar30 = bVar8;
      }
      if (pCVar15 != (ClosedFileInputSource *)0x0) {
        ClosedFileInputSource::stayOpen(pCVar15,false);
      }
    }
  }
  local_158._M_unused._M_object = (void *)0x0;
  local_158._8_8_ = 0;
  local_140 = std::
              _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2512:17)>
              ::_M_invoke;
  local_148 = std::
              _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2512:17)>
              ::_M_manager;
  doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_158);
  std::_Function_base::~_Function_base((_Function_base *)&local_158);
  QPDFPageDocumentHelper::QPDFPageDocumentHelper(&dh,pdf);
  QPDFPageDocumentHelper::getAllPages(&orig_pages,&dh);
  pQVar7 = orig_pages.
           super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>._M_impl.
           super__Vector_impl_data._M_finish;
  for (pQVar38 = orig_pages.
                 super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>.
                 _M_impl.super__Vector_impl_data._M_start; pQVar38 != pQVar7; pQVar38 = pQVar38 + 1)
  {
    QPDFPageObjectHelper::QPDFPageObjectHelper(&local_68,pQVar38);
    QPDFPageDocumentHelper::removePage(&dh,&local_68);
    QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_68);
  }
  peVar12 = (this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  puVar2 = (peVar12->collate).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
           _M_impl.super__Vector_impl_data._M_start;
  puVar3 = *(pointer *)
            ((long)&(peVar12->collate).
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data + 8);
  pCVar43 = (ClosedFileInputSource *)((long)puVar3 - (long)puVar2 >> 3);
  local_478 = parsed_specs.
              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  uVar41 = (long)parsed_specs.
                 super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)parsed_specs.
                 super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                 ._M_impl.super__Vector_impl_data._M_start;
  pCVar15 = (ClosedFileInputSource *)((long)uVar41 / 0x58);
  if (((ClosedFileInputSource *)0x1 < pCVar43) && (pCVar43 != pCVar15)) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&filenames,
               "--pages: if --collate has more than one value, it must have one value per page specification"
               ,(allocator<char> *)&qpdf_sp);
    usage((string *)&filenames);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&new_page.super_BaseHandle.obj.
                super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&filenames);
    QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&pldh);
    std::
    _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
    ::~_Rb_tree(&referenced_fields._M_t);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
    ::~_Rb_tree(&afdh_map._M_t);
    std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_labels);
    std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
              (&selected_from_orig._M_t);
    std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&orig_pages);
    QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&dh);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_bool>,_std::_Select1st<std::pair<const_unsigned_long_long,_bool>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
    ::~_Rb_tree(&remove_unreferenced._M_t);
    std::
    _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
    ::~_Rb_tree(&copied_pages._M_t);
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::~vector(&parsed_specs);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
    ::~_Rb_tree(&page_spec_cfis._M_t);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
    ::~_Rb_tree(&page_spec_qpdfs._M_t);
    _Unwind_Resume(extraout_RAX);
  }
  pQVar24 = parsed_specs.
            super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
            ._M_impl.super__Vector_impl_data._M_start;
  if ((puVar3 != puVar2) && ((ClosedFileInputSource *)0x1 < pCVar15)) {
    local_470 = parsed_specs.
                super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ._M_impl.super__Vector_impl_data._M_start;
    filenames._M_t._M_impl._0_8_ = 0;
    filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    filenames._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    for (; pCVar43 < pCVar15;
        pCVar43 = (ClosedFileInputSource *)
                  ((long)&(pCVar43->super_InputSource)._vptr_InputSource + 1)) {
      this_06 = &((this->m).super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
                 ->collate;
      pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(this_06,0);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back(this_06,pvVar20);
    }
    selected_from_orig._M_t._M_impl._0_8_ = 0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&qpdf_sp,(size_type)pCVar15,
               (value_type_conflict4 *)&selected_from_orig,(allocator_type *)&afdh_map);
    local_528 = (QPDFPageData *)0x0;
    local_530 = (QPDFPageData *)0x0;
    pQVar24 = (pointer)0x0;
    pCVar43 = (ClosedFileInputSource *)0x0;
    pQVar40 = local_470;
    local_468 = pCVar15;
    bVar8 = false;
    do {
      for (; bVar10 = bVar8, pCVar43 < pCVar15;
          pCVar43 = (ClosedFileInputSource *)
                    ((long)&(pCVar43->super_InputSource)._vptr_InputSource + 1)) {
        pQVar44 = pQVar40 + (long)pCVar43;
        local_530 = pQVar24;
        for (uVar39 = 0;
            pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                (&((this->m).
                                   super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                                  _M_ptr)->collate,(size_type)pCVar43), uVar39 < *pvVar20;
            uVar39 = uVar39 + 1) {
          pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&qpdf_sp,
                               (size_type)pCVar43);
          p_Var33 = (_Tp_alloc_type *)
                    ((long)(pQVar44->selected_pages).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                     (long)(pQVar44->selected_pages).super__Vector_base<int,_std::allocator<int>_>.
                           _M_impl.super__Vector_impl_data._M_start >> 2);
          if ((_Tp_alloc_type *)(*pvVar20 + uVar39) < p_Var33) {
            pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&qpdf_sp,
                                 (size_type)pCVar43);
            __n_02 = *pvVar20 + uVar39;
            pQVar23 = (QPDFPageData *)
                      std::vector<int,_std::allocator<int>_>::at
                                (&pQVar40[(long)pCVar43].selected_pages,__n_02);
            if (local_528 ==
                (QPDFPageData *)filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
              p_Var18 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                         *)std::
                           vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                           ::_M_check_len((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                                           *)&filenames,__n_02,__s_00);
              pQVar24 = std::
                        _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                        ::_M_allocate(p_Var18,__n_02);
              lVar42 = (long)local_528 - (long)local_530;
              std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
              construct<(anonymous_namespace)::QPDFPageData,(anonymous_namespace)::QPDFPageData&,int&>
                        ((allocator_type *)((long)pQVar24 + lVar42),pQVar44,pQVar23,(int *)p_Var33);
              pQVar25 = std::
                        vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                        ::_S_relocate(local_530,local_528,pQVar24,p_Var33);
              local_528 = std::
                          vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                          ::_S_relocate(local_528,local_528,pQVar25 + 1,p_Var33);
              std::
              _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ::_M_deallocate((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                               *)local_530,(pointer)(lVar42 / 0x58),lVar42 % 0x58);
              filenames._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
                   (_Base_ptr)(pQVar24 + (long)p_Var18);
              bVar10 = true;
              pCVar15 = local_468;
              local_530 = pQVar24;
              filenames._M_t._M_impl._0_8_ = pQVar24;
              filenames._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_528;
            }
            else {
              std::allocator_traits<std::allocator<(anonymous_namespace)::QPDFPageData>>::
              construct<(anonymous_namespace)::QPDFPageData,(anonymous_namespace)::QPDFPageData&,int&>
                        ((allocator_type *)local_528,pQVar44,pQVar23,(int *)p_Var33);
              local_528 = local_528 + 1;
              bVar10 = true;
              filenames._M_t._M_impl.super__Rb_tree_header._M_header._0_8_ = local_528;
            }
          }
        }
        pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            (&((this->m).
                               super___shared_ptr<QPDFJob::Members,_(__gnu_cxx::_Lock_policy)2>.
                              _M_ptr)->collate,(size_type)pCVar43);
        vVar4 = *pvVar20;
        pvVar20 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&qpdf_sp,
                             (size_type)pCVar43);
        *pvVar20 = *pvVar20 + vVar4;
        pQVar40 = local_470;
        bVar8 = bVar10;
      }
      pCVar43 = (ClosedFileInputSource *)0x0;
      bVar8 = false;
    } while (bVar10);
    __n_03 = (long)local_528 - (long)local_530;
    p_Var18 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
               *)((long)__n_03 / 0x58);
    uVar39 = (long)parsed_specs.
                   super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pQVar40;
    if (uVar39 < __n_03) {
      pQVar26 = std::
                _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                ::_M_allocate(p_Var18,__n_03);
      pQVar24 = pQVar26;
      for (; local_530 != local_528; local_530 = local_530 + 1) {
        anon_unknown.dwarf_2a937c::QPDFPageData::QPDFPageData(pQVar24,local_530);
        pQVar24 = pQVar24 + 1;
      }
      std::_Destroy<(anonymous_namespace)::QPDFPageData*>(pQVar40,local_478);
      std::
      _Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ::_M_deallocate((_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       *)pQVar40,(pointer)((long)uVar39 / 0x58),(long)uVar39 % 0x58);
      parsed_specs.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)((long)pQVar26 + __n_03);
      parsed_specs.
      super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ._M_impl.super__Vector_impl_data._M_start = pQVar26;
    }
    else {
      pCVar15 = local_468;
      pQVar44 = local_530;
      if (uVar41 < __n_03) {
        for (; 0 < (long)pCVar15; pCVar15 = (ClosedFileInputSource *)&pCVar15[-1].field_0xe7) {
          anon_unknown.dwarf_2a937c::QPDFPageData::operator=(pQVar40,pQVar44);
          pQVar40 = pQVar40 + 1;
          pQVar44 = pQVar44 + 1;
        }
        pQVar40 = local_478;
        for (local_530 = (QPDFPageData *)((long)local_530 + uVar41); local_530 != local_528;
            local_530 = local_530 + 1) {
          anon_unknown.dwarf_2a937c::QPDFPageData::QPDFPageData(pQVar40,local_530);
          pQVar40 = pQVar40 + 1;
        }
      }
      else {
        for (; 0 < (long)p_Var18;
            p_Var18 = (_Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                       *)((long)&p_Var18[-1]._M_impl.super__Vector_impl_data._M_end_of_storage + 7))
        {
          anon_unknown.dwarf_2a937c::QPDFPageData::operator=(pQVar40,local_530);
          local_530 = local_530 + 1;
          pQVar40 = pQVar40 + 1;
        }
        for (; pQVar40 != local_478; pQVar40 = pQVar40 + 1) {
          anon_unknown.dwarf_2a937c::QPDFPageData::~QPDFPageData(pQVar40);
        }
      }
    }
    pQVar24 = parsed_specs.
              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
              ._M_impl.super__Vector_impl_data._M_start;
    pQVar40 = (QPDFPageData *)
              (__n_03 + (long)parsed_specs.
                              super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
                              ._M_impl.super__Vector_impl_data._M_start);
    parsed_specs.
    super__Vector_base<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ._M_impl.super__Vector_impl_data._M_finish = pQVar40;
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&qpdf_sp);
    std::
    vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
    ::~vector((vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
               *)&filenames);
    local_478 = pQVar40;
  }
  selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_header;
  selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  new_labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  new_labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  new_labels.super__Vector_base<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  afdh_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &afdh_map._M_t._M_impl.super__Rb_tree_header._M_header;
  afdh_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  afdh_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  afdh_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  afdh_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       afdh_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       selected_from_orig._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  this_01 = get_afdh_for_qpdf(&afdh_map,pdf);
  referenced_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &referenced_fields._M_t._M_impl.super__Rb_tree_header._M_header;
  referenced_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  referenced_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  referenced_fields._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_528 = (QPDFPageData *)0x0;
  local_470 = (QPDFPageData *)0x0;
  referenced_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       referenced_fields._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if (pQVar24 == local_478) {
      if (((ulong)local_470 & 1) != 0) {
        QPDFObjectHandle::newDictionary();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filenames,"/Nums",(allocator<char> *)&fields);
        QPDFObjectHandle::newArray((QPDFObjectHandle *)&pldh,&new_labels);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&qpdf_sp,(string *)&filenames,(QPDFObjectHandle *)&pldh);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pldh.super_QPDFDocumentHelper.qpdf
                  );
        std::__cxx11::string::~string((string *)&filenames);
        QPDF::getRoot((QPDF *)&pldh);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filenames,"/PageLabels",(allocator<char> *)&fields);
        QPDFObjectHandle::replaceKey
                  ((QPDFObjectHandle *)&pldh,(string *)&filenames,(QPDFObjectHandle *)&qpdf_sp);
        std::__cxx11::string::~string((string *)&filenames);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pldh.super_QPDFDocumentHelper.qpdf
                  );
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
      }
      for (new_fields.super_BaseHandle.obj.
           super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
          new_fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr < (element_type *)
                    (((long)orig_pages.
                            super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                     (long)orig_pages.
                           super__Vector_base<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>
                           ._M_impl.super__Vector_impl_data._M_start) / 0x38);
          new_fields.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr = (element_type *)
                    ((long)&((new_fields.super_BaseHandle.obj.
                              super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                            value).
                            super__Variant_base<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            .
                            super__Move_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            .
                            super__Copy_assign_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            .
                            super__Move_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            .
                            super__Copy_ctor_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                            .
                            super__Variant_storage_alias<std::monostate,_QPDF_Reserved,_QPDF_Null,_QPDF_Bool,_QPDF_Integer,_QPDF_Real,_QPDF_String,_QPDF_Name,_QPDF_Array,_QPDF_Dictionary,_QPDF_Stream,_QPDF_Operator,_QPDF_InlineImage,_QPDF_Unresolved,_QPDF_Destroyed,_QPDF_Reference>
                    + 1)) {
        pvVar32 = std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::at
                            (&orig_pages,
                             (size_type)
                             new_fields.super_BaseHandle.obj.
                             super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
        QPDFPageObjectHelper::QPDFPageObjectHelper((QPDFPageObjectHelper *)&filenames,pvVar32);
        iVar11 = QIntC::IntConverter<unsigned_long,_int,_false,_true>::convert
                           ((unsigned_long *)&new_fields);
        qpdf_sp._M_t.super___uniq_ptr_impl<QPDF,_std::default_delete<QPDF>_>._M_t.
        super__Tuple_impl<0UL,_QPDF_*,_std::default_delete<QPDF>_>.
        super__Head_base<0UL,_QPDF_*,_false>._M_head_impl._0_4_ = iVar11;
        sVar31 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                           (&selected_from_orig,(key_type *)&qpdf_sp);
        if (sVar31 == 0) {
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qpdf_sp,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                     &filenames._M_t._M_impl.super__Rb_tree_header);
          og = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&qpdf_sp);
          QPDFObjectHandle::newNull();
          QPDF::replaceObject(pdf,og,&local_368);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_368.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
        }
        else {
          QPDFPageObjectHelper::QPDFPageObjectHelper(&local_a0,(QPDFPageObjectHelper *)&filenames);
          QPDFAcroFormDocumentHelper::getFormFieldsForPage
                    ((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>
                      *)&pldh,this_01,&local_a0);
          QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_a0);
          pQVar37 = pldh.super_QPDFDocumentHelper.qpdf;
          for (pQVar45 = (QPDFFormFieldObjectHelper *)
                         pldh.super_QPDFDocumentHelper._vptr_QPDFDocumentHelper;
              pQVar45 != (QPDFFormFieldObjectHelper *)pQVar37; pQVar45 = pQVar45 + 1) {
            QPDFFormFieldObjectHelper::QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)&qpdf_sp,pQVar45);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&fields,local_4a8);
            local_3a8[0].oh.super_BaseHandle.obj.
            super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)QPDFObjectHandle::getObjGen(&fields);
            std::
            _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
            ::_M_insert_unique<QPDFObjGen>(&referenced_fields._M_t,(QPDFObjGen *)local_3a8);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&fields.super_BaseHandle.obj.
                        super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            QPDFFormFieldObjectHelper::~QPDFFormFieldObjectHelper
                      ((QPDFFormFieldObjectHelper *)&qpdf_sp);
          }
          std::vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_>::
          ~vector((vector<QPDFFormFieldObjectHelper,_std::allocator<QPDFFormFieldObjectHelper>_> *)
                  &pldh);
        }
        QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&filenames);
      }
      bVar8 = QPDFAcroFormDocumentHelper::hasAcroForm(this_01);
      if (bVar8) {
        QPDF::getRoot((QPDF *)&qpdf_sp);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filenames,"/AcroForm",(allocator<char> *)&fields);
        QPDFObjectHandle::getKey((QPDFObjectHandle *)&pldh,(string *)&qpdf_sp);
        std::__cxx11::string::~string((string *)&filenames);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&filenames,"/Fields",(allocator<char> *)&qpdf_sp);
        QPDFObjectHandle::getKey(&fields,(string *)&pldh);
        std::__cxx11::string::~string((string *)&filenames);
        bVar8 = QPDFObjectHandle::isArray(&fields);
        if (bVar8) {
          QPDFObjectHandle::newArray();
          bVar8 = QPDFObjectHandle::isIndirect(&fields);
          if (bVar8) {
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                      (&local_338,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&new_fields);
            QPDF::makeIndirectObject((QPDF *)&filenames,(QPDFObjectHandle *)pdf);
            std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::operator=
                      ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&new_fields,
                       (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&filenames);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                       &filenames._M_t._M_impl.super__Rb_tree_header);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_338._M_refcount)
            ;
          }
          QPDFObjectHandle::aitems(&local_3a8[0].oh);
          QPDFObjectHandle::QPDFArrayItems::begin((iterator *)&filenames,local_3a8);
          QPDFObjectHandle::QPDFArrayItems::end((iterator *)&qpdf_sp,local_3a8);
          while (bVar8 = QPDFObjectHandle::QPDFArrayItems::iterator::operator!=
                                   ((iterator *)&filenames,(iterator *)&qpdf_sp), bVar8) {
            this_05 = QPDFObjectHandle::QPDFArrayItems::iterator::operator*((iterator *)&filenames);
            new_page.super_BaseHandle.obj.super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr = (element_type *)QPDFObjectHandle::getObjGen(this_05);
            sVar29 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                               (&referenced_fields,(key_type *)&new_page);
            if (sVar29 != 0) {
              QPDFObjectHandle::appendItem(&new_fields,this_05);
            }
            QPDFObjectHandle::QPDFArrayItems::iterator::operator++((iterator *)&filenames);
          }
          QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&qpdf_sp);
          QPDFObjectHandle::QPDFArrayItems::iterator::~iterator((iterator *)&filenames);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&local_3a8[0].oh.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
          iVar11 = QPDFObjectHandle::getArrayNItems(&new_fields);
          if (iVar11 < 1) {
            QPDF::getRoot((QPDF *)&qpdf_sp);
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&filenames,"/AcroForm",(allocator<char> *)local_3a8);
            QPDFObjectHandle::removeKey((QPDFObjectHandle *)&qpdf_sp,(string *)&filenames);
            std::__cxx11::string::~string((string *)&filenames);
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
          }
          else {
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&filenames,"/Fields",(allocator<char> *)&qpdf_sp);
            QPDFObjectHandle::replaceKey((QPDFObjectHandle *)&pldh,(string *)&filenames,&new_fields)
            ;
            std::__cxx11::string::~string((string *)&filenames);
          }
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    (&new_fields.super_BaseHandle.obj.
                      super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        }
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&fields.super_BaseHandle.obj.
                    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&pldh.super_QPDFDocumentHelper.qpdf
                  );
      }
      std::
      _Rb_tree<QPDFObjGen,_QPDFObjGen,_std::_Identity<QPDFObjGen>,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>
      ::~_Rb_tree(&referenced_fields._M_t);
      std::
      _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::shared_ptr<QPDFAcroFormDocumentHelper>_>_>_>
      ::~_Rb_tree(&afdh_map._M_t);
      std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::~vector(&new_labels);
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                (&selected_from_orig._M_t);
      std::vector<QPDFPageObjectHelper,_std::allocator<QPDFPageObjectHelper>_>::~vector(&orig_pages)
      ;
      QPDFPageDocumentHelper::~QPDFPageDocumentHelper(&dh);
      std::
      _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_bool>,_std::_Select1st<std::pair<const_unsigned_long_long,_bool>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
      ::~_Rb_tree(&remove_unreferenced._M_t);
      std::
      _Rb_tree<unsigned_long_long,_std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>,_std::_Select1st<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
      ::~_Rb_tree(&copied_pages._M_t);
      std::
      vector<(anonymous_namespace)::QPDFPageData,_std::allocator<(anonymous_namespace)::QPDFPageData>_>
      ::~vector(&parsed_specs);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
      ::~_Rb_tree(&page_spec_cfis._M_t);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_QPDF_*>_>_>
      ::~_Rb_tree(&page_spec_qpdfs._M_t);
      return;
    }
    sVar27 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
             ::count(&page_spec_cfis,&pQVar24->filename);
    if (sVar27 == 0) {
      local_468 = (ClosedFileInputSource *)0x0;
    }
    else {
      ppCVar17 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_ClosedFileInputSource_*>_>_>
                 ::operator[](&page_spec_cfis,&pQVar24->filename);
      local_468 = *ppCVar17;
      ClosedFileInputSource::stayOpen(local_468,true);
    }
    QPDFPageLabelDocumentHelper::QPDFPageLabelDocumentHelper(&pldh,pQVar24->qpdf);
    this_02 = get_afdh_for_qpdf(&afdh_map,pQVar24->qpdf);
    bVar8 = QPDFPageLabelDocumentHelper::hasPageLabels(&pldh);
    local_358._8_8_ = 0;
    local_340 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2576:21)>
                ::_M_invoke;
    local_348 = std::
                _Function_handler<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFJob.cc:2576:21)>
                ::_M_manager;
    local_358._M_unused._0_8_ = (undefined8)pQVar24;
    doIfVerbose(this,(function<void_(Pipeline_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_358);
    local_470 = (QPDFPageData *)CONCAT71((int7)((ulong)local_470 >> 8),(byte)local_470 | bVar8);
    std::_Function_base::~_Function_base((_Function_base *)&local_358);
    piVar5 = (pQVar24->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
             super__Vector_impl_data._M_finish;
    local_528 = (QPDFPageData *)(long)(int)local_528;
    for (piVar34 = (pQVar24->selected_pages).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start; piVar34 != piVar5; piVar34 = piVar34 + 1) {
      lVar42 = (long)*piVar34 + -1;
      pageno = (int)lVar42;
      QPDFPageLabelDocumentHelper::getLabelsForPageRange
                (&pldh,lVar42,lVar42,(longlong)local_528,&new_labels);
      __n_00 = QIntC::IntConverter<int,_unsigned_long,_true,_false>::convert(&pageno);
      p_Var28 = (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                std::vector<QPDFObjectHandle,_std::allocator<QPDFObjectHandle>_>::at
                          (&pQVar24->orig_pages,__n_00);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr(&local_308,p_Var28);
      QPDFPageObjectHelper::QPDFPageObjectHelper
                ((QPDFPageObjectHelper *)&filenames,(QPDFObjectHandle *)&local_308);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_308._M_refcount);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qpdf_sp,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &filenames._M_t._M_impl.super__Rb_tree_header);
      to_copy_og = QPDFObjectHandle::getObjGen((QPDFObjectHandle *)&qpdf_sp);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
      from_uuid = QPDF::getUniqueId(pQVar24->qpdf);
      this_03 = std::
                map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                ::operator[](&copied_pages,&from_uuid);
      sVar29 = std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>::count
                         (this_03,&to_copy_og);
      if (sVar29 == 0) {
        this_04 = (_Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
                   *)std::
                     map<unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_std::set<QPDFObjGen,_std::less<QPDFObjGen>,_std::allocator<QPDFObjGen>_>_>_>_>
                     ::operator[](&copied_pages,&from_uuid);
        std::
        _Rb_tree<QPDFObjGen,QPDFObjGen,std::_Identity<QPDFObjGen>,std::less<QPDFObjGen>,std::allocator<QPDFObjGen>>
        ::_M_insert_unique<QPDFObjGen_const&>(this_04,&to_copy_og);
        pmVar30 = std::
                  map<unsigned_long_long,_bool,_std::less<unsigned_long_long>,_std::allocator<std::pair<const_unsigned_long_long,_bool>_>_>
                  ::operator[](&remove_unreferenced,&from_uuid);
        if (*pmVar30 == true) {
          QPDFPageObjectHelper::removeUnreferencedResources((QPDFPageObjectHelper *)&filenames);
        }
      }
      else {
        QPDFPageObjectHelper::shallowCopyPage
                  ((QPDFPageObjectHelper *)&qpdf_sp,(QPDFPageObjectHelper *)&filenames);
        QPDFPageObjectHelper::operator=
                  ((QPDFPageObjectHelper *)&filenames,(QPDFPageObjectHelper *)&qpdf_sp);
        QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&qpdf_sp);
      }
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_110,(QPDFPageObjectHelper *)&filenames);
      QPDFPageDocumentHelper::addPage(&dh,&local_110,false);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_110);
      pQVar37 = pQVar24->qpdf;
      if (pQVar37 == pdf) {
        sVar31 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                           (&selected_from_orig,&pageno);
        std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
        _M_insert_unique<int_const&>
                  ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
                   &selected_from_orig,&pageno);
        bVar8 = sVar31 == 0;
      }
      else {
        bVar8 = false;
      }
      QPDFPageObjectHelper::QPDFPageObjectHelper(&local_d8,(QPDFPageObjectHelper *)&filenames);
      std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                ((__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&qpdf_sp,
                 (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                 &local_d8.super_QPDFObjectHelper.super_BaseHandle);
      added_page((QPDF *)&new_page,(QPDFObjectHandle *)pdf);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)local_4a8);
      QPDFPageObjectHelper::~QPDFPageObjectHelper(&local_d8);
      if (pQVar37 == pdf) {
        if (!bVar8) goto LAB_0015f095;
      }
      else {
        bVar10 = QPDFAcroFormDocumentHelper::hasAcroForm(this_02);
        if (bVar10 || !bVar8) {
LAB_0015f095:
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_318,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)&new_page);
          std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                    (&local_328,
                     (__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)
                     &filenames._M_t._M_impl.super__Rb_tree_header);
          QPDFAcroFormDocumentHelper::fixCopiedAnnotations
                    (this_01,(QPDFObjectHandle *)&local_318,(QPDFObjectHandle *)&local_328,this_02,
                     &referenced_fields);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_328._M_refcount);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_318._M_refcount);
        }
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&new_page.super_BaseHandle.obj.
                  super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      QPDFPageObjectHelper::~QPDFPageObjectHelper((QPDFPageObjectHelper *)&filenames);
      local_528 = (QPDFPageData *)((long)local_528 + 1);
    }
    if (local_468 != (ClosedFileInputSource *)0x0) {
      ClosedFileInputSource::stayOpen(local_468,false);
    }
    QPDFPageLabelDocumentHelper::~QPDFPageLabelDocumentHelper(&pldh);
    pQVar24 = pQVar24 + 1;
  } while( true );
}

Assistant:

void
QPDFJob::handlePageSpecs(QPDF& pdf, std::vector<std::unique_ptr<QPDF>>& page_heap)
{
    // Parse all page specifications and translate them into lists of actual pages.

    // Handle "." as a shortcut for the input file
    for (auto& page_spec: m->page_specs) {
        if (page_spec.filename == ".") {
            page_spec.filename = m->infilename.get();
        }
        if (page_spec.range.empty()) {
            page_spec.range = "1-z";
        }
    }

    if (!m->keep_files_open_set) {
        // Count the number of distinct files to determine whether we should keep files open or not.
        // Rather than trying to code some portable heuristic based on OS limits, just hard-code
        // this at a given number and allow users to override.
        std::set<std::string> filenames;
        for (auto& page_spec: m->page_specs) {
            filenames.insert(page_spec.filename);
        }
        m->keep_files_open = (filenames.size() <= m->keep_files_open_threshold);
        QTC::TC("qpdf", "QPDFJob automatically set keep files open", m->keep_files_open ? 0 : 1);
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": selecting --keep-open-files=" << (m->keep_files_open ? "y" : "n")
              << "\n";
        });
    }

    // Create a QPDF object for each file that we may take pages from.
    std::map<std::string, QPDF*> page_spec_qpdfs;
    std::map<std::string, ClosedFileInputSource*> page_spec_cfis;
    page_spec_qpdfs[m->infilename.get()] = &pdf;
    std::vector<QPDFPageData> parsed_specs;
    std::map<unsigned long long, std::set<QPDFObjGen>> copied_pages;
    for (auto& page_spec: m->page_specs) {
        if (page_spec_qpdfs.count(page_spec.filename) == 0) {
            // Open the PDF file and store the QPDF object. Throw a std::shared_ptr to the qpdf into
            // a heap so that it survives through copying to the output but gets cleaned up
            // automatically at the end. Do not canonicalize the file name. Using two different
            // paths to refer to the same file is a documented workaround for duplicating a page. If
            // you are using this an example of how to do this with the API, you can just create two
            // different QPDF objects to the same underlying file with the same path to achieve the
            // same effect.
            char const* password = page_spec.password.get();
            if ((!m->encryption_file.empty()) && (password == nullptr) &&
                (page_spec.filename == m->encryption_file)) {
                QTC::TC("qpdf", "QPDFJob pages encryption password");
                password = m->encryption_file_password.get();
            }
            doIfVerbose([&](Pipeline& v, std::string const& prefix) {
                v << prefix << ": processing " << page_spec.filename << "\n";
            });
            std::shared_ptr<InputSource> is;
            ClosedFileInputSource* cis = nullptr;
            if (!m->keep_files_open) {
                QTC::TC("qpdf", "QPDFJob keep files open n");
                cis = new ClosedFileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(cis);
                cis->stayOpen(true);
            } else {
                QTC::TC("qpdf", "QPDFJob keep files open y");
                FileInputSource* fis = new FileInputSource(page_spec.filename.c_str());
                is = std::shared_ptr<InputSource>(fis);
            }
            std::unique_ptr<QPDF> qpdf_sp;
            processInputSource(qpdf_sp, is, password, true);
            page_spec_qpdfs[page_spec.filename] = qpdf_sp.get();
            page_heap.push_back(std::move(qpdf_sp));
            if (cis) {
                cis->stayOpen(false);
                page_spec_cfis[page_spec.filename] = cis;
            }
        }

        // Read original pages from the PDF, and parse the page range associated with this
        // occurrence of the file.
        parsed_specs.emplace_back(
            page_spec.filename, page_spec_qpdfs[page_spec.filename], page_spec.range);
    }

    std::map<unsigned long long, bool> remove_unreferenced;
    if (m->remove_unreferenced_page_resources != QPDFJob::re_no) {
        for (auto const& iter: page_spec_qpdfs) {
            std::string const& filename = iter.first;
            ClosedFileInputSource* cis = nullptr;
            if (page_spec_cfis.count(filename)) {
                cis = page_spec_cfis[filename];
                cis->stayOpen(true);
            }
            QPDF& other(*(iter.second));
            auto other_uuid = other.getUniqueId();
            if (remove_unreferenced.count(other_uuid) == 0) {
                remove_unreferenced[other_uuid] = shouldRemoveUnreferencedResources(other);
            }
            if (cis) {
                cis->stayOpen(false);
            }
        }
    }

    // Clear all pages out of the primary QPDF's pages tree but leave the objects in place in the
    // file so they can be re-added without changing their object numbers. This enables other things
    // in the original file, such as outlines, to continue to work.
    doIfVerbose([&](Pipeline& v, std::string const& prefix) {
        v << prefix << ": removing unreferenced pages from primary input\n";
    });
    QPDFPageDocumentHelper dh(pdf);
    std::vector<QPDFPageObjectHelper> orig_pages = dh.getAllPages();
    for (auto const& page: orig_pages) {
        dh.removePage(page);
    }

    auto n_collate = m->collate.size();
    auto n_specs = parsed_specs.size();
    if (!(n_collate == 0 || n_collate == 1 || n_collate == n_specs)) {
        usage(
            "--pages: if --collate has more than one value, it must have one value per page "
            "specification");
    }
    if (n_collate > 0 && n_specs > 1) {
        // Collate the pages by selecting one page from each spec in order. When a spec runs out of
        // pages, stop selecting from it.
        std::vector<QPDFPageData> new_parsed_specs;
        // Make sure we have a collate value for each spec. We have already checked that a non-empty
        // collate has either one value or one value per spec.
        for (auto i = n_collate; i < n_specs; ++i) {
            m->collate.push_back(m->collate.at(0));
        }
        std::vector<size_t> cur_page(n_specs, 0);
        bool got_pages = true;
        while (got_pages) {
            got_pages = false;
            for (size_t i = 0; i < n_specs; ++i) {
                QPDFPageData& page_data = parsed_specs.at(i);
                for (size_t j = 0; j < m->collate.at(i); ++j) {
                    if (cur_page.at(i) + j < page_data.selected_pages.size()) {
                        got_pages = true;
                        new_parsed_specs.emplace_back(
                            page_data, page_data.selected_pages.at(cur_page.at(i) + j));
                    }
                }
                cur_page.at(i) += m->collate.at(i);
            }
        }
        parsed_specs = new_parsed_specs;
    }

    // Add all the pages from all the files in the order specified. Keep track of any pages from the
    // original file that we are selecting.
    std::set<int> selected_from_orig;
    std::vector<QPDFObjectHandle> new_labels;
    bool any_page_labels = false;
    int out_pageno = 0;
    std::map<unsigned long long, std::shared_ptr<QPDFAcroFormDocumentHelper>> afdh_map;
    auto this_afdh = get_afdh_for_qpdf(afdh_map, &pdf);
    std::set<QPDFObjGen> referenced_fields;
    for (auto& page_data: parsed_specs) {
        ClosedFileInputSource* cis = nullptr;
        if (page_spec_cfis.count(page_data.filename)) {
            cis = page_spec_cfis[page_data.filename];
            cis->stayOpen(true);
        }
        QPDFPageLabelDocumentHelper pldh(*page_data.qpdf);
        auto other_afdh = get_afdh_for_qpdf(afdh_map, page_data.qpdf);
        if (pldh.hasPageLabels()) {
            any_page_labels = true;
        }
        doIfVerbose([&](Pipeline& v, std::string const& prefix) {
            v << prefix << ": adding pages from " << page_data.filename << "\n";
        });
        for (auto pageno_iter: page_data.selected_pages) {
            // Pages are specified from 1 but numbered from 0 in the vector
            int pageno = pageno_iter - 1;
            pldh.getLabelsForPageRange(pageno, pageno, out_pageno++, new_labels);
            QPDFPageObjectHelper to_copy = page_data.orig_pages.at(QIntC::to_size(pageno));
            QPDFObjGen to_copy_og = to_copy.getObjectHandle().getObjGen();
            unsigned long long from_uuid = page_data.qpdf->getUniqueId();
            if (copied_pages[from_uuid].count(to_copy_og)) {
                QTC::TC(
                    "qpdf",
                    "QPDFJob copy same page more than once",
                    (page_data.qpdf == &pdf) ? 0 : 1);
                to_copy = to_copy.shallowCopyPage();
            } else {
                copied_pages[from_uuid].insert(to_copy_og);
                if (remove_unreferenced[from_uuid]) {
                    to_copy.removeUnreferencedResources();
                }
            }
            dh.addPage(to_copy, false);
            bool first_copy_from_orig = false;
            bool this_file = (page_data.qpdf == &pdf);
            if (this_file) {
                // This is a page from the original file. Keep track of the fact that we are using
                // it.
                first_copy_from_orig = (selected_from_orig.count(pageno) == 0);
                selected_from_orig.insert(pageno);
            }
            auto new_page = added_page(pdf, to_copy);
            // Try to avoid gratuitously renaming fields. In the case of where we're just extracting
            // a bunch of pages from the original file and not copying any page more than once,
            // there's no reason to do anything with the fields. Since we don't remove fields from
            // the original file until all copy operations are completed, any foreign pages that
            // conflict with original pages will be adjusted. If we copy any page from the original
            // file more than once, that page would be in conflict with the previous copy of itself.
            if ((!this_file && other_afdh->hasAcroForm()) || !first_copy_from_orig) {
                if (!this_file) {
                    QTC::TC("qpdf", "QPDFJob copy fields not this file");
                } else if (!first_copy_from_orig) {
                    QTC::TC("qpdf", "QPDFJob copy fields non-first from orig");
                }
                try {
                    this_afdh->fixCopiedAnnotations(
                        new_page, to_copy.getObjectHandle(), *other_afdh, &referenced_fields);
                } catch (std::exception& e) {
                    pdf.warn(
                        qpdf_e_damaged_pdf,
                        "",
                        0,
                        ("Exception caught while fixing copied annotations. This may be a qpdf "
                         "bug. " +
                         std::string("Exception: ") + e.what()));
                }
            }
        }
        if (cis) {
            cis->stayOpen(false);
        }
    }
    if (any_page_labels) {
        QPDFObjectHandle page_labels = QPDFObjectHandle::newDictionary();
        page_labels.replaceKey("/Nums", QPDFObjectHandle::newArray(new_labels));
        pdf.getRoot().replaceKey("/PageLabels", page_labels);
    }

    // Delete page objects for unused page in primary. This prevents those objects from being
    // preserved by being referred to from other places, such as the outlines dictionary. Also make
    // sure we keep form fields from pages we preserved.
    for (size_t pageno = 0; pageno < orig_pages.size(); ++pageno) {
        auto page = orig_pages.at(pageno);
        if (selected_from_orig.count(QIntC::to_int(pageno))) {
            for (auto field: this_afdh->getFormFieldsForPage(page)) {
                QTC::TC("qpdf", "QPDFJob pages keeping field from original");
                referenced_fields.insert(field.getObjectHandle().getObjGen());
            }
        } else {
            pdf.replaceObject(page.getObjectHandle().getObjGen(), QPDFObjectHandle::newNull());
        }
    }
    // Remove unreferenced form fields
    if (this_afdh->hasAcroForm()) {
        auto acroform = pdf.getRoot().getKey("/AcroForm");
        auto fields = acroform.getKey("/Fields");
        if (fields.isArray()) {
            auto new_fields = QPDFObjectHandle::newArray();
            if (fields.isIndirect()) {
                new_fields = pdf.makeIndirectObject(new_fields);
            }
            for (auto const& field: fields.aitems()) {
                if (referenced_fields.count(field.getObjGen())) {
                    new_fields.appendItem(field);
                }
            }
            if (new_fields.getArrayNItems() > 0) {
                QTC::TC("qpdf", "QPDFJob keep some fields in pages");
                acroform.replaceKey("/Fields", new_fields);
            } else {
                QTC::TC("qpdf", "QPDFJob no more fields in pages");
                pdf.getRoot().removeKey("/AcroForm");
            }
        }
    }
}